

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_SwapRoundTripZero_Test::
~Proto3OptionalTest_SwapRoundTripZero_Test(Proto3OptionalTest_SwapRoundTripZero_Test *this)

{
  Proto3OptionalTest_SwapRoundTripZero_Test *this_local;
  
  ~Proto3OptionalTest_SwapRoundTripZero_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3OptionalTest, SwapRoundTripZero) {
  proto2_unittest::TestProto3Optional msg;
  SetAllFieldsZero(&msg);
  TestAllFieldsSet(msg, true);

  proto2_unittest::TestProto3Optional msg2;
  msg.Swap(&msg2);
  TestAllFieldsSet(msg2, true);
  TestAllFieldsZero(msg2);
}